

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setupPupdate(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SVSetBase<double> *A;
  SSVectorBase<double> *this_00;
  SSVectorBase<double> *in_RDI;
  SSVectorBase<double> *unaff_retaddr;
  SVSetBase<double> *in_stack_00000008;
  SSVectorBase<double> *in_stack_00000010;
  SVSetBase<double> *in_stack_00000018;
  SSVectorBase<double> *c;
  SSVectorBase<double> *p;
  SSVectorBase<double> *x;
  
  x = in_RDI;
  A = (SVSetBase<double> *)
      UpdateVector<double>::delta
                ((UpdateVector<double> *)
                 in_RDI[0x15].super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage);
  this_00 = UpdateVector<double>::delta
                      ((UpdateVector<double> *)
                       in_RDI[0x15].super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  bVar1 = SSVectorBase<double>::isSetup(this_00);
  if (bVar1) {
    iVar2 = SSVectorBase<double>::size((SSVectorBase<double> *)0x22418a);
    iVar3 = VectorBase<double>::dim((VectorBase<double> *)0x2241a7);
    if ((double)iVar3 * 0.95 <= (double)iVar2) {
      (**(code **)(**(long **)&in_RDI[0x1c].setupStatus + 0x18))();
      SSVectorBase<double>::assign2product<double,double>(unaff_retaddr,x,A);
      (**(code **)(**(long **)&in_RDI[0x1c].setupStatus + 0x20))();
      *(int *)&in_RDI[0x1d].super_IdxSet._vptr_IdxSet =
           *(int *)&in_RDI[0x1d].super_IdxSet._vptr_IdxSet + 1;
    }
    else {
      SSVectorBase<double>::assign2product4setup<double,double>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Timer *)x,(Timer *)A,
                 (int *)this_00,(int *)c);
    }
  }
  else {
    (**(code **)((long)(in_RDI[0x1c]._tolerances.
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       s_epsilon + 0x18))();
    SSVectorBase<double>::assign2productAndSetup<double,double>
              (c,in_stack_00000018,in_stack_00000010);
    (**(code **)((long)(in_RDI[0x1c]._tolerances.
                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       s_epsilon + 0x20))();
    *(int *)((long)&in_RDI[0x1d].super_IdxSet._vptr_IdxSet + 4) =
         *(int *)((long)&in_RDI[0x1d].super_IdxSet._vptr_IdxSet + 4) + 1;
  }
  SSVectorBase<double>::setup(in_RDI);
  return;
}

Assistant:

void SPxSolverBase<R>::setupPupdate(void)
{
   SSVectorBase<R>& p = thePvec->delta();
   SSVectorBase<R>& c = theCoPvec->delta();

   if(c.isSetup())
   {
      if(c.size() < 0.95 * theCoPvec->dim())
         p.assign2product4setup(*thecovectors, c,
                                multTimeSparse, multTimeFull,
                                multSparseCalls, multFullCalls);
      else
      {
         multTimeColwise->start();
         p.assign2product(c, *thevectors);
         multTimeColwise->stop();
         ++multColwiseCalls;
      }
   }
   else
   {
      multTimeUnsetup->start();
      p.assign2productAndSetup(*thecovectors, c);
      multTimeUnsetup->stop();
      ++multUnsetupCalls;
   }

   p.setup();
}